

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_expr.hpp
# Opt level: O3

rt_expression_interface<double> * __thiscall
viennamath::op_unary<viennamath::op_exp<double>,_viennamath::rt_expression_interface<double>_>::
simplify(op_unary<viennamath::op_exp<double>,_viennamath::rt_expression_interface<double>_> *this,
        rt_expression_interface<double> *lhs,rt_expression_interface<double> *rhs)

{
  int iVar1;
  int iVar2;
  rt_expression_interface<double> *prVar3;
  undefined4 extraout_var;
  _func_int **pp_Var4;
  undefined4 extraout_var_00;
  
  prVar3 = (rt_expression_interface<double> *)operator_new(0x20);
  iVar1 = (*lhs->_vptr_rt_expression_interface[2])(lhs);
  pp_Var4 = (_func_int **)operator_new(0x10);
  *pp_Var4 = (_func_int *)&PTR__op_interface_00112d20;
  iVar2 = (*rhs->_vptr_rt_expression_interface[2])(rhs);
  prVar3->_vptr_rt_expression_interface = (_func_int **)&PTR__rt_binary_expr_00112840;
  prVar3[1]._vptr_rt_expression_interface = (_func_int **)CONCAT44(extraout_var,iVar1);
  prVar3[2]._vptr_rt_expression_interface = pp_Var4;
  prVar3[3]._vptr_rt_expression_interface = (_func_int **)CONCAT44(extraout_var_00,iVar2);
  return prVar3;
}

Assistant:

InterfaceType * op_unary<T, InterfaceType>::simplify(const InterfaceType * lhs,
                                                       const InterfaceType * rhs) const
  {
    return new rt_binary_expr<InterfaceType>(lhs->clone(),
                                          new op_unary<T, InterfaceType>(),
                                          rhs->clone());
  }